

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_progname.c
# Opt level: O0

char * zt_progname(char *name,int opts)

{
  size_t sVar1;
  int in_ESI;
  char *in_RDI;
  char *unaff_retaddr;
  size_t local_20;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  char *__s;
  
  if ((in_RDI != (char *)0x0) && (*in_RDI != '\0')) {
    memset(_progname,0,0x1000);
    if (in_ESI == 1) {
      zt_cstr_basename(unaff_retaddr,(size_t)in_RDI,(char *)CONCAT44(1,in_stack_fffffffffffffff0),
                       in_stack_ffffffffffffffe8);
    }
    else {
      __s = in_RDI;
      sVar1 = strlen(in_RDI);
      if (sVar1 < 0x1001) {
        local_20 = strlen(__s);
      }
      else {
        local_20 = 0x1000;
      }
      memcpy(_progname,in_RDI,local_20);
    }
  }
  return _progname;
}

Assistant:

char *
zt_progname(const char *name, int opts)
{
    if (name && *name != '\0') {
        memset(_progname, '\0', PATH_MAX);
        if (opts == STRIP_DIR) {
            zt_cstr_basename(_progname, PATH_MAX, name, NULL);
        } else {
            memcpy(_progname, name, MIN(PATH_MAX, strlen(name)));
        }
    }
    return _progname;
}